

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O1

shared_ptr<MPL::ModelPackageItemInfo> __thiscall
MPL::detail::ModelPackageImpl::getRootModel(ModelPackageImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  JsonMap *pJVar2;
  bool bVar3;
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  string *in_RSI;
  shared_ptr<MPL::ModelPackageItemInfo> sVar5;
  string rootModelIdentifier;
  string local_70;
  string local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  pJVar2 = *(JsonMap **)((long)&in_RSI[3].field_2 + 8);
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"rootModelIdentifier","");
  bVar3 = JsonMap::hasKey(pJVar2,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    pJVar2 = *(JsonMap **)((long)&in_RSI[3].field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"rootModelIdentifier","");
    JsonMap::getString(&local_70,pJVar2,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    sVar5 = findItem(this,in_RSI);
    _Var4 = sVar5.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      _Var4._M_pi = extraout_RDX;
    }
    sVar5.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var4._M_pi;
    sVar5.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<MPL::ModelPackageItemInfo>)
           sVar5.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Failed to look up root model");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<ModelPackageItemInfo> ModelPackageImpl::getRootModel() const
{
    if (false == m_manifest->hasKey(kModelPackageRootModelKey)) {
        throw std::runtime_error("Failed to look up root model");
    }
    
    auto rootModelIdentifier = m_manifest->getString(kModelPackageRootModelKey);
    return findItem(rootModelIdentifier);
}